

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::Prim::set_primdata<tinyusdz::SkelRoot>(Prim *this,SkelRoot *prim)

{
  string local_118;
  Path local_f8;
  
  linb::any::operator=(&(this->_data).v_,prim);
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
  Path::Path(&local_f8,&prim->name,&local_118);
  Path::operator=(&this->_elementPath,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._element._M_dataplus._M_p != &local_f8._element.field_2) {
    operator_delete(local_f8._element._M_dataplus._M_p,
                    local_f8._element.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._variant_part_str._M_dataplus._M_p != &local_f8._variant_part_str.field_2) {
    operator_delete(local_f8._variant_part_str._M_dataplus._M_p,
                    local_f8._variant_part_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._variant_selection_part._M_dataplus._M_p !=
      &local_f8._variant_selection_part.field_2) {
    operator_delete(local_f8._variant_selection_part._M_dataplus._M_p,
                    local_f8._variant_selection_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._variant_part._M_dataplus._M_p != &local_f8._variant_part.field_2) {
    operator_delete(local_f8._variant_part._M_dataplus._M_p,
                    local_f8._variant_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._prop_part._M_dataplus._M_p != &local_f8._prop_part.field_2) {
    operator_delete(local_f8._prop_part._M_dataplus._M_p,
                    local_f8._prop_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._prim_part._M_dataplus._M_p != &local_f8._prim_part.field_2) {
    operator_delete(local_f8._prim_part._M_dataplus._M_p,
                    local_f8._prim_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void set_primdata(const T &prim) {
    // Check if T is Prim class type.
    static_assert((value::TypeId::TYPE_ID_MODEL_BEGIN <=
                   value::TypeTraits<T>::type_id()) &&
                      (value::TypeId::TYPE_ID_MODEL_END >
                       value::TypeTraits<T>::type_id()),
                  "T is not a Prim class type");
    _data = prim;
    // Use prim.name for elementName
    _elementPath = Path(prim.name, "");
  }